

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O3

ZoneState *
QLocalTime::mapLocalTime(ZoneState *__return_storage_ptr__,qint64 local,TransitionOptions resolve)

{
  DaylightStatus DVar1;
  undefined1 *puVar2;
  bool bVar3;
  long lVar4;
  qint64 qVar5;
  long in_FS_OFFSET;
  MkTimeResult use;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  char *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_312447::resolveLocalTime((MkTimeResult *)&local_78,local / 1000,resolve);
  DVar1 = UnknownDaylightTime;
  puVar2 = (undefined1 *)0x0;
  if (local_38._0_1_ == true) {
    lVar4 = (long)(puStack_40 + (int)puStack_50) * 1000;
    qVar5 = lVar4 + local % 1000;
    puVar2 = puStack_50;
    if (!SCARRY8(lVar4,local % 1000) &&
        SEXT816(lVar4) == SEXT816((long)(puStack_40 + (int)puStack_50)) * SEXT416(1000)) {
      DVar1 = (DaylightStatus)(0 < (int)local_58);
      bVar3 = true;
      goto LAB_001269d8;
    }
  }
  bVar3 = false;
  qVar5 = local;
LAB_001269d8:
  __return_storage_ptr__->when = qVar5;
  __return_storage_ptr__->offset = (int)puVar2;
  __return_storage_ptr__->dst = DVar1;
  __return_storage_ptr__->valid = bVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimePrivate::ZoneState mapLocalTime(qint64 local, QDateTimePrivate::TransitionOptions resolve)
{
    // Revised later to match what use.local tells us:
    qint64 localSecs = local / MSECS_PER_SEC;
    auto use = resolveLocalTime(localSecs, resolve);
    if (!use.good)
        return {local};

    qint64 millis = local - localSecs * MSECS_PER_SEC;
    // Division is defined to round towards zero:
    Q_ASSERT(local < 0 ? (millis <= 0 && millis > -MSECS_PER_SEC)
                       : (millis >= 0 && millis < MSECS_PER_SEC));

    QDateTimePrivate::DaylightStatus dst =
        use.local.tm_isdst > 0 ? QDateTimePrivate::DaylightTime : QDateTimePrivate::StandardTime;

#ifdef HAVE_TM_GMTOFF
    const int offset = use.local.tm_gmtoff;
    localSecs = offset + use.utcSecs;
#else
    // Provisional offset, until we have a revised localSecs:
    int offset = localSecs - use.utcSecs;
    auto jd = tmToJd(use.local);
    if (Q_UNLIKELY(!jd))
        return {local, offset, dst, false};

    qint64 daySecs = tmSecsWithinDay(use.local);
    Q_ASSERT(0 <= daySecs && daySecs < SECS_PER_DAY);
    if (daySecs > 0 && *jd < JULIAN_DAY_FOR_EPOCH) {
        jd = *jd + 1;
        daySecs -= SECS_PER_DAY;
    }
    if (Q_UNLIKELY(daysAndSecondsOverflow(*jd, daySecs, &localSecs)))
        return {local, offset, dst, false};

    // Use revised localSecs to refine offset:
    offset = localSecs - use.utcSecs;
#endif // HAVE_TM_GMTOFF

    // The only way localSecs and millis can now have opposite sign is for
    // resolution of the local time to have kicked us across the epoch, in which
    // case there's no danger of overflow. So if overflow is in danger of
    // happening, we're already doing the best we can to avoid it.
    qint64 revised;
    if (secondsAndMillisOverflow(localSecs, millis, &revised))
        return {local, offset, QDateTimePrivate::UnknownDaylightTime, false};
    return {revised, offset, dst, true};
}